

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O1

char * cm_zlib_gzerror(gzFile file,int *errnum)

{
  char *pcVar1;
  
  if ((file == (gzFile)0x0) || ((file[1].have != 0x79b1 && (file[1].have != 0x1c4f)))) {
    return (char *)0x0;
  }
  if (errnum != (int *)0x0) {
    *errnum = *(int *)((long)&file[4].pos + 4);
  }
  if (*(int *)((long)&file[4].pos + 4) == -4) {
    return "out of memory";
  }
  pcVar1 = "";
  if (*(char **)(file + 5) != (char *)0x0) {
    pcVar1 = *(char **)(file + 5);
  }
  return pcVar1;
}

Assistant:

const char * ZEXPORT gzerror(gzFile file, int *errnum) {
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return NULL;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return NULL;

    /* return error information */
    if (errnum != NULL)
        *errnum = state->err;
    return state->err == Z_MEM_ERROR ? "out of memory" :
                                       (state->msg == NULL ? "" : state->msg);
}